

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O1

uint128 CityHash128(char *s,size_t len)

{
  uint128 uVar1;
  uint128 seed;
  
  if (0xf < len) {
    seed.second = *(long *)(s + 8) + 0xc3a5c85c97cb3127;
    seed.first = *(unsigned_long *)s;
    uVar1 = CityHash128WithSeed(s + 0x10,len - 0x10,seed);
    return uVar1;
  }
  uVar1.second = 0xb492b66fbe98f273;
  uVar1.first = 0xc3a5c85c97cb3127;
  uVar1 = CityHash128WithSeed(s,len,uVar1);
  return uVar1;
}

Assistant:

uint128 CityHash128(const char *s, size_t len) {
  return len >= 16 ?
      CityHash128WithSeed(s + 16, len - 16,
                          uint128(Fetch64(s), Fetch64(s + 8) + k0)) :
      CityHash128WithSeed(s, len, uint128(k0, k1));
}